

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgenericshape.cpp
# Opt level: O0

void ComputeTransforms<pzshape::TPZShapePoint>
               (TPZVec<long> *id,TPZVec<TPZTransform<double>_> *transvec)

{
  TPZTransform<double> *this;
  TPZVec<TPZTransform<double>_> *in_RSI;
  TPZVec<long> *in_RDI;
  int trans_id;
  int pos;
  int iside;
  int NCorners;
  int NSides;
  int in_stack_00000628;
  int in_stack_0000062c;
  TPZTransform<double> *in_stack_fffffffffffffe18;
  int local_1c;
  
  (*in_RSI->_vptr_TPZVec[4])(in_RSI,0);
  for (local_1c = 1; local_1c < 1; local_1c = local_1c + 1) {
    pztopology::TPZPoint::GetTransformId(local_1c,in_RDI);
    GetSideTransform<pzshape::TPZShapePoint>(in_stack_0000062c,in_stack_00000628);
    this = TPZVec<TPZTransform<double>_>::operator[](in_RSI,(long)(local_1c + -1));
    TPZTransform<double>::operator=(this,in_stack_fffffffffffffe18);
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x186cd7f);
  }
  return;
}

Assistant:

void ComputeTransforms(const TPZVec<int64_t> &id,  TPZVec<TPZTransform<REAL> > &transvec) {
    int NSides = TSHAPE::NSides;
    int NCorners = TSHAPE::NCornerNodes;
    transvec.resize(NSides - NCorners);
    for (int iside = NCorners; iside< NSides ; iside++) {
        int pos = iside - NCorners;
        int trans_id = TSHAPE::GetTransformId(iside, id); // Foi criado
        transvec[pos] = GetSideTransform<TSHAPE>(iside, trans_id); // Foi criado
    }
}